

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa-generate.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  char cVar1;
  int iVar2;
  allocator<char> local_39;
  long *local_38 [2];
  long local_28 [2];
  
  if (argc < 2) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"verifyrsa - https://github.com/rodlie/verifyrsa",0x2f);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'P');
    std::ostream::put('P');
    std::ostream::flush();
    iVar2 = 0;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"",0);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'P');
    std::ostream::put('P');
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Usage: rsa-generate <key suffix> <bits>",0x27);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'P');
    std::ostream::put('P');
    std::ostream::flush();
  }
  else {
    iVar2 = 0x800;
    if (argc != 2) {
      iVar2 = atoi(argv[2]);
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)local_38,argv[1],&local_39);
    cVar1 = VerifyRSA::generate((string *)local_38,iVar2);
    if (local_38[0] != local_28) {
      operator_delete(local_38[0],local_28[0] + 1);
    }
    iVar2 = 0;
    if (cVar1 == '\0') {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Unable to generate keys!",0x18);
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x60);
      std::ostream::put(-0x60);
      std::ostream::flush();
      iVar2 = 1;
    }
  }
  return iVar2;
}

Assistant:

int main(int argc, char* argv[]) {
    if (argc<2) {
        std::cout << "verifyrsa - https://github.com/rodlie/verifyrsa" << std::endl;
        std::cout << "" << std::endl;
        std::cout << "Usage: rsa-generate <key suffix> <bits>" << std::endl;
        return 0;
    }
    int bits = argc>2?atoi(argv[2]):2048;
    if (!VerifyRSA::generate(argv[1], bits)) {
        std::cerr << "Unable to generate keys!" << std::endl;
        return 1;
    }
    return 0;
}